

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall enact::Parser::synchronise(Parser *this)

{
  uint uVar1;
  
  advance(this);
  while ((uVar1 = (this->m_current).type - ENUM, 0x18 < uVar1 ||
         ((0x10a04d9U >> (uVar1 & 0x1f) & 1) == 0))) {
    advance(this);
  }
  return;
}

Assistant:

void Parser::synchronise() {
        advance();

        while (!isAtEnd()) {
            switch (m_current.type) {
                case TokenType::ENUM:
                case TokenType::FOR:
                case TokenType::FUNC:
                case TokenType::IMM:
                case TokenType::IMPL:
                case TokenType::MUT:
                case TokenType::STRUCT:
                case TokenType::TRAIT:
                    return;
            }

            advance();
        }
    }